

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *this,exception_ptr *error)

{
  void *pvVar1;
  void *__tmp;
  void *pvVar2;
  
  pvVar2 = error->_M_exception_object;
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  pvVar1 = (this->m_error).m_data._M_exception_object;
  (this->m_error).m_data._M_exception_object = pvVar2;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }